

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol_Program.h
# Opt level: O1

void __thiscall psy::C::ProgramSymbol::~ProgramSymbol(ProgramSymbol *this)

{
  Symbol::~Symbol(&this->super_Symbol);
  operator_delete(this,0x10);
  return;
}

Assistant:

class PSY_C_API ProgramSymbol final : public Symbol
{
public:
    //!@{
    /**
     * Cast \c this Symbol as a ProgramSymbol.
     */
    virtual ProgramSymbol* asProgram() override { return this; }
    virtual const ProgramSymbol* asProgram() const override { return this; }
    //!@}

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(Compilation);
    PSY_GRANT_INTERNAL_ACCESS(SemanticModel);

    DECL_PIMPL_SUB(Program);
    ProgramSymbol();
}